

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

size_t google::protobuf::internal::(anonymous_namespace)::
       SizeOfUnion<google::protobuf::internal::ExtensionSet::KeyValue*,std::_Rb_tree_iterator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
                 (KeyValue *it_xs,KeyValue *end_xs,
                 _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                 it_ys,_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                       end_ys)

{
  int iVar1;
  bool bVar2;
  pointer ppVar3;
  difference_type dVar4;
  difference_type dVar5;
  _Base_ptr in_RCX;
  _Base_ptr in_RDX;
  int *in_RSI;
  int *in_RDI;
  size_t result;
  int iVar6;
  uint in_stack_ffffffffffffffc4;
  KeyValue *in_stack_ffffffffffffffc8;
  KeyValue *in_stack_ffffffffffffffd0;
  long local_28;
  int *local_18;
  _Self local_10;
  _Self local_8;
  
  local_28 = 0;
  local_18 = in_RDI;
  local_10._M_node = in_RCX;
  local_8._M_node = in_RDX;
  while( true ) {
    in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc4 & 0xffffff;
    if (local_18 != in_RSI) {
      bVar2 = std::operator!=(&local_8,&local_10);
      in_stack_ffffffffffffffc4 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffffc4);
    }
    if ((char)(in_stack_ffffffffffffffc4 >> 0x18) == '\0') break;
    local_28 = local_28 + 1;
    iVar6 = *local_18;
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                           *)0x496246);
    if (iVar6 < ppVar3->first) {
      local_18 = local_18 + 8;
    }
    else {
      iVar1 = *local_18;
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                             *)0x496276);
      if (iVar1 == ppVar3->first) {
        local_18 = local_18 + 8;
        std::
        _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
        ::operator++((_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                      *)CONCAT44(in_stack_ffffffffffffffc4,iVar6));
      }
      else {
        std::
        _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
        ::operator++((_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                      *)CONCAT44(in_stack_ffffffffffffffc4,iVar6));
      }
    }
  }
  dVar4 = std::distance<google::protobuf::internal::ExtensionSet::KeyValue*>
                    (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  dVar5 = std::
          distance<std::_Rb_tree_iterator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
                    ((_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                      )local_8._M_node,
                     (_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                      )local_10._M_node);
  return dVar5 + dVar4 + local_28;
}

Assistant:

size_t SizeOfUnion(ItX it_xs, ItX end_xs, ItY it_ys, ItY end_ys) {
  size_t result = 0;
  while (it_xs != end_xs && it_ys != end_ys) {
    ++result;
    if (it_xs->first < it_ys->first) {
      ++it_xs;
    } else if (it_xs->first == it_ys->first) {
      ++it_xs;
      ++it_ys;
    } else {
      ++it_ys;
    }
  }
  result += std::distance(it_xs, end_xs);
  result += std::distance(it_ys, end_ys);
  return result;
}